

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_head.c
# Opt level: O3

void key_match(char **strs,int nstr,char **pattern,int exact,int *ikey,int *mkey)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  ulong uVar5;
  uint uVar6;
  code *__compar;
  
  *mkey = -999;
  *ikey = -99;
  if (exact == 0) {
    __compar = compstrp;
  }
  else {
    __compar = compstre;
  }
  pvVar4 = bsearch(pattern,strs,(long)nstr,8,__compar);
  if (pvVar4 != (void *)0x0) {
    *mkey = 1;
    uVar5 = (ulong)((long)pvVar4 - (long)strs) >> 3;
    uVar6 = (uint)uVar5;
    *ikey = uVar6;
    pvVar1 = pvVar4;
    if (1 < (int)uVar6) {
      do {
        iVar2 = (*__compar)(pattern,(void *)((long)pvVar1 + -8));
        if (iVar2 != 0) {
          uVar6 = *ikey;
          break;
        }
        iVar2 = (int)uVar5;
        uVar6 = iVar2 - 1;
        *mkey = *mkey + 1;
        *ikey = uVar6;
        uVar5 = (ulong)uVar6;
        pvVar1 = (void *)((long)pvVar1 + -8);
      } while (2 < iVar2);
    }
    for (iVar2 = uVar6 + *mkey; iVar2 < nstr; iVar2 = iVar2 + 1) {
      pvVar4 = (void *)((long)pvVar4 + 8);
      iVar3 = (*__compar)(pattern,pvVar4);
      if (iVar3 != 0) {
        return;
      }
      *mkey = *mkey + 1;
    }
  }
  return;
}

Assistant:

void key_match(char **strs,  	/* fits keyname  array */
             int nstr,		/* total number of keys */
             char **pattern,	/* wanted pattern  */ 
             int exact,		/* exact matching or pattern matching  
                                   exact = 1: exact matching.
                                   exact = 0: pattern matching. 
                                   Any keywords with "patten"* is included
                                */
                                
             int *ikey,		/* The element number of first key 
                                   Return -99 if not found */ 
             int *mkey		/* total number of key matched 
                                   return -999 if not found */
            )  			
{ 
     char **p;
     char **pi;
     int i;
     int (*fnpt)(const void *, const void *); 
     *mkey = -999;
     *ikey = -99;
     if(exact)  
	 fnpt = compstre;
     else 
         fnpt = compstrp;
     p = (char **)bsearch(pattern, strs, nstr,sizeof(char *), fnpt); 
     if(p) {	    
        *mkey = 1; 
        *ikey = p - strs; 
	pi = p;
	i = *ikey - 1;
	p--;
        while(i > 0 && !fnpt(pattern, p)) {*mkey += 1; *ikey =i; i--; p--;}
	p = pi;
	i = *ikey + *mkey;
        p++;
        while(i < nstr && !fnpt(pattern, p) ) {*mkey += 1; i++; p++;}
     }
     return;
}